

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowerMDShared.cpp
# Opt level: O1

Instr * LowererMD::InsertCmovCC
                  (OpCode opCode,Opnd *dst,Opnd *src1,Instr *insertBeforeInstr,bool postRegAlloc)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Opnd *src2Opnd;
  Instr *instr;
  undefined6 in_register_0000003a;
  Opnd *src1Opnd;
  
  if ((uint)CONCAT62(in_register_0000003a,opCode) < 0x3d5) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                       ,0x227f,"(opCode > Js::OpCode::MDStart)","opCode > Js::OpCode::MDStart");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  src2Opnd = (Opnd *)0x0;
  src1Opnd = src1;
  if (!postRegAlloc) {
    src1Opnd = dst;
    src2Opnd = src1;
  }
  instr = IR::Instr::New(opCode,dst,src1Opnd,src2Opnd,insertBeforeInstr->m_func);
  IR::Instr::InsertBefore(insertBeforeInstr,instr);
  Legalize<false>(instr,false);
  return instr;
}

Assistant:

IR::Instr*
LowererMD::InsertCmovCC(const Js::OpCode opCode, IR::Opnd * dst, IR::Opnd* src1, IR::Instr* insertBeforeInstr, bool postRegAlloc)
{
    Assert(opCode > Js::OpCode::MDStart);
    Func* func = insertBeforeInstr->m_func;

    IR::Opnd* src2 = nullptr;
    if (!postRegAlloc)
    {
        src2 = src1;
        src1 = dst;
    }
    IR::Instr * instr = IR::Instr::New(opCode, dst, src1, src2, func);
    insertBeforeInstr->InsertBefore(instr);
    LowererMD::Legalize(instr);

    return instr;
}